

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_is_when_false(lyd_node *root,lyd_node *last_parent,lys_node *schema,int options)

{
  int iVar1;
  undefined8 in_RAX;
  lyd_node *node;
  lys_node *stop;
  lyd_node *node_00;
  int iVar2;
  undefined8 uStack_38;
  int_log_opts prev_ilo;
  
  iVar2 = 0;
  if ((options & 0x10000ffU) == 0 || (options & 0x1000071U) != 0) {
    iVar2 = 0;
    if (last_parent == (lyd_node *)0x0) {
      stop = (lys_node *)0x0;
    }
    else {
      stop = last_parent->schema;
    }
    uStack_38 = in_RAX;
    iVar1 = resolve_applies_when(schema,1,stop);
    if (iVar1 != 0) {
      if (schema->nodetype == LYS_CHOICE) {
        schema = lys_getnext((lys_node *)0x0,schema,(lys_module *)0x0,0x100);
      }
      node = lyd_new_dummy(root,last_parent,schema,(char *)0x0,0);
      if (node == (lyd_node *)0x0) {
        iVar2 = -1;
      }
      else {
        if ((root != (lyd_node *)0x0) && (node->parent == (lyd_node *)0x0)) {
          lyd_insert_before(root,node);
        }
        iVar2 = 0;
        for (node_00 = node; node_00 != (lyd_node *)0x0; node_00 = node_00->child) {
          ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)((long)&uStack_38 + 4),
                        (ly_err_item **)0x0);
          resolve_when(node_00,0,(lys_when **)0x0);
          ly_ilo_restore((ly_ctx *)0x0,uStack_38._4_4_,(ly_err_item *)0x0,0);
          if ((node_00->field_0x9 & 2) != 0) {
            iVar2 = 1;
            break;
          }
          if ((node_00->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
          break;
        }
        lyd_free(node);
      }
    }
  }
  return iVar2;
}

Assistant:

static int
lyd_is_when_false(struct lyd_node *root, struct lyd_node *last_parent, struct lys_node *schema, int options)
{
    enum int_log_opts prev_ilo;
    struct lyd_node *current, *dummy;

    if ((!(options & LYD_OPT_TYPEMASK) || (options & (LYD_OPT_CONFIG | LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF | LYD_OPT_DATA_TEMPLATE)))
            && resolve_applies_when(schema, 1, last_parent ? last_parent->schema : NULL)) {
        /* evaluate when statements on a dummy data node */
        if (schema->nodetype == LYS_CHOICE) {
            schema = (struct lys_node *)lys_getnext(NULL, schema, NULL, LYS_GETNEXT_NOSTATECHECK);
        }
        dummy = lyd_new_dummy(root, last_parent, schema, NULL, 0);
        if (!dummy) {
            return -1;
        }
        if (!dummy->parent && root) {
            /* connect dummy nodes into the data tree, insert it before the root
             * to optimize later unlinking (lyd_free()) */
            lyd_insert_before(root, dummy);
        }
        for (current = dummy; current; current = current->child) {
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            resolve_when(current, 0, NULL);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);

            if (current->when_status & LYD_WHEN_FALSE) {
                /* when evaluates to false */
                lyd_free(dummy);
                return 1;
            }

            if (current->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                /* termination node without a child */
                break;
            }
        }
        lyd_free(dummy);
    }

    return 0;
}